

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep-lstm.h
# Opt level: O1

vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> * __thiscall
cnn::DeepLSTMBuilder::final_s
          (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
           *__return_storage_ptr__,DeepLSTMBuilder *this)

{
  pointer pvVar1;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *__x;
  undefined8 *puVar2;
  Expression my_h;
  undefined8 *local_48;
  undefined8 *local_40;
  value_type local_30;
  
  pvVar1 = (this->c).
           super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __x = pvVar1 + -1;
  if (pvVar1 == (this->c).
                super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    __x = &this->c0;
  }
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (__return_storage_ptr__,__x);
  (*(this->super_RNNBuilder)._vptr_RNNBuilder[3])(&local_48,this);
  if (local_48 != local_40) {
    puVar2 = local_48;
    do {
      local_30.pg = (ComputationGraph *)*puVar2;
      local_30.i.t = *(uint *)(puVar2 + 1);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
                (__return_storage_ptr__,&local_30);
      puVar2 = puVar2 + 2;
    } while (puVar2 != local_40);
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Expression> final_s() const override {
    std::vector<Expression> ret = (c.size() == 0 ? c0 : c.back());
    for(auto my_h : final_h()) ret.push_back(my_h);
    return ret;
  }